

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void madd_stride(double *A,double *B,double *C,int rows,int cols,int sA,int sB,int sC)

{
  int w;
  int v;
  int u;
  int j;
  int i;
  int sA_local;
  int cols_local;
  int rows_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  for (u = 0; u < rows; u = u + 1) {
    for (v = 0; v < cols; v = v + 1) {
      C[v + u * sC] = A[v + u * sA] + B[v + u * sB];
    }
  }
  return;
}

Assistant:

void madd_stride(double* A, double* B, double* C,int rows,int cols,int sA,int sB,int sC) {
	int i,j,u,v,w;
	 
	for (i = 0; i < rows; ++i) {
		u = i * sC;
		v = i * sA;
		w = i * sB;
		for(j = 0; j < cols;j++) {
			C[j + u] = A[j + v] + B[j + w];
		}
	}
}